

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCopyDeepScanLine.cpp
# Opt level: O3

void testCopyDeepScanLine(string *tempDir)

{
  int count;
  ThreadPool *pTVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\n\nTesting raw data copy in DeepScanLineInput/OutputFile:\n",
             0x39);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  random_reseed(1);
  pTVar1 = IlmThread_2_5::ThreadPool::globalThreadPool();
  count = IlmThread_2_5::ThreadPool::numThreads(pTVar1);
  pTVar1 = IlmThread_2_5::ThreadPool::globalThreadPool();
  IlmThread_2_5::ThreadPool::setNumThreads(pTVar1,4);
  anon_unknown.dwarf_cdd9c::readCopyWriteTest(tempDir,1,100);
  anon_unknown.dwarf_cdd9c::readCopyWriteTest(tempDir,3,0x32);
  anon_unknown.dwarf_cdd9c::readCopyWriteTest(tempDir,10,10);
  pTVar1 = IlmThread_2_5::ThreadPool::globalThreadPool();
  IlmThread_2_5::ThreadPool::setNumThreads(pTVar1,count);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ok\n",3);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  return;
}

Assistant:

void testCopyDeepScanLine (const std::string &tempDir)
{
    try
    {
        cout << "\n\nTesting raw data copy in DeepScanLineInput/OutputFile:\n" << endl;

        random_reseed(1);

        int numThreads = ThreadPool::globalThreadPool().numThreads();
        ThreadPool::globalThreadPool().setNumThreads(4);

        
        readCopyWriteTest (tempDir,  1, 100);
        readCopyWriteTest (tempDir,  3,  50);
        readCopyWriteTest (tempDir, 10,  10);

        ThreadPool::globalThreadPool().setNumThreads(numThreads);

        cout << "ok\n" << endl;
    }
    catch (const std::exception &e)
    {
        cerr << "ERROR -- caught exception: " << e.what() << endl;
        assert (false);
    }
}